

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  
  if (str != (char *)0x0) {
    sVar3 = (size_t)(uint)len;
    if (len < 1) {
      sVar3 = strlen(str);
    }
    if ((-1 < (int)sVar3) &&
       ((target != (char *)0x0 ||
        (target = (char *)(*xmlMalloc)((size_t)sVar3 + 1), (byte *)target != (byte *)0x0)))) {
      pbVar4 = (byte *)target;
      if ((int)sVar3 != 0) {
        do {
          iVar6 = (int)sVar3;
          if ((((iVar6 < 3) || (*str != 0x25)) ||
              ((bVar1 = ((byte *)str)[1], 9 < (byte)(bVar1 - 0x30) &&
               ((byte)((bVar1 & 0xdf) + 0xb9) < 0xfa)))) ||
             ((bVar2 = ((byte *)str)[2], 9 < (byte)(bVar2 - 0x30) &&
              ((byte)((bVar2 & 0xdf) + 0xb9) < 0xfa)))) {
            bVar1 = *str;
            str = (char *)((byte *)str + 1);
            *pbVar4 = bVar1;
            uVar7 = iVar6 - 1;
          }
          else {
            if ((byte)(bVar1 - 0x30) < 10) {
              bVar5 = bVar1 - 0x30;
            }
            else if ((byte)(bVar1 + 0x9f) < 6) {
              bVar5 = bVar1 + 0xa9;
            }
            else {
              bVar5 = 0;
              if ((byte)(bVar1 + 0xbf) < 6) {
                bVar5 = bVar1 - 0x37;
              }
            }
            if ((byte)(bVar2 - 0x30) < 10) {
              bVar5 = bVar5 << 4 | bVar2 - 0x30;
            }
            else if ((byte)(bVar2 + 0x9f) < 6) {
              bVar5 = bVar5 * '\x10' + bVar2 + 0xa9;
            }
            else if ((byte)(bVar2 + 0xbf) < 6) {
              bVar5 = (bVar5 * '\x10' + bVar2) - 0x37;
            }
            str = (char *)((byte *)str + 3);
            uVar7 = iVar6 - 3;
            *pbVar4 = bVar5;
          }
          sVar3 = (size_t)uVar7;
          pbVar4 = pbVar4 + 1;
        } while (0 < (int)uVar7);
      }
      *pbVar4 = 0;
      return (char *)(byte *)target;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = xmlMalloc(len + 1);
	if (ret == NULL)
	    return(NULL);
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
            int c = 0;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = c * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = c * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = c * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
            /* Explicit sign change */
	    *out++ = (char) c;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}